

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> * __thiscall
testing::internal::FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::With
          (FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *this,Matcher<int> *m1)

{
  MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *pMVar1;
  FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *in_RDI;
  Matcher<int> *in_stack_ffffffffffffffa8;
  
  FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::current_spec(in_RDI);
  std::make_tuple<testing::Matcher<int>const&>(in_stack_ffffffffffffffa8);
  MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::SetMatchers
            ((MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *)in_RDI,
             (ArgumentMatcherTuple *)in_stack_ffffffffffffffa8);
  std::tuple<testing::Matcher<int>_>::~tuple((tuple<testing::Matcher<int>_> *)0x1cfa21);
  pMVar1 = FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::current_spec(in_RDI);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }